

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O3

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<std::__cxx11::string,std::__cxx11::string,std::equal_to<std::__cxx11::string>,void>
          (linear_node *this,undefined8 db,undefined8 *key)

{
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  database_reader *archive;
  database_reader *extraout_RDX;
  database_reader *extraout_RDX_00;
  database_reader *pdVar4;
  long lVar5;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> existing_key;
  database_reader *local_78;
  index_pointer local_70;
  undefined8 local_60;
  undefined8 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar1 = this->size_;
  archive = (database_reader *)0xffffffffffffffff;
  if (uVar1 == 0) {
    local_70.internal_ = (internal_node *)0x0;
    local_78 = archive;
  }
  else {
    lVar5 = 0;
    pdVar4 = (database_reader *)0x0;
    do {
      local_58 = *(undefined8 *)((long)&this->leaves_[0].a_ + lVar5);
      local_60 = db;
      serialize::read<std::__cxx11::string,pstore::serialize::archive::database_reader>
                (&local_50,(serialize *)&local_60,archive);
      archive = (database_reader *)local_50._M_string_length;
      if (((database_reader *)local_50._M_string_length == (database_reader *)key[1]) &&
         (((database_reader *)local_50._M_string_length == (database_reader *)0x0 ||
          (iVar3 = bcmp(local_50._M_dataplus._M_p,(void *)*key,local_50._M_string_length),
          archive = extraout_RDX, iVar3 == 0)))) {
        local_70 = (index_pointer)((index_pointer *)((long)&this->leaves_[0].a_ + lVar5))->internal_
        ;
        bVar2 = true;
        local_78 = pdVar4;
      }
      else {
        pdVar4 = (database_reader *)((long)&pdVar4->db_ + 1);
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        ::operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        archive = extraout_RDX_00;
      }
      if (bVar2) goto LAB_0010ba52;
      lVar5 = lVar5 + 8;
    } while (uVar1 << 3 != lVar5);
    local_70.internal_ = (internal_node *)0x0;
    local_78 = (database_reader *)0xffffffffffffffff;
  }
LAB_0010ba52:
  pVar6.second = (unsigned_long)local_78;
  pVar6.first.internal_ = local_70.internal_;
  return pVar6;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }